

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O1

VirtualIterator<Kernel::Term_*> __thiscall
Kernel::EqHelper::getRewritableSubtermIterator<Kernel::NonVariableNonTypeIterator>
          (EqHelper *this,Literal *lit,Ordering *ord)

{
  int *piVar1;
  int iVar2;
  Result RVar3;
  undefined8 *puVar4;
  ItemList *pIVar5;
  ulong uVar6;
  TermList *pTVar7;
  NonVariableNonTypeIterator *this_00;
  ItemList *pIVar8;
  Term *term;
  NonVariableNonTypeIterator si;
  VirtualIterator<Kernel::Term_*> local_58;
  NonVariableNonTypeIterator local_50;
  
  if ((lit->super_Term)._functor == 0) {
    RVar3 = Ordering::getEqualityArgumentOrder(ord,lit);
    switch(RVar3) {
    case GREATER:
    case EQUAL:
      pTVar7 = (lit->super_Term)._args + (*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
      break;
    case LESS:
      pTVar7 = (lit->super_Term)._args +
               ((ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - 1);
      break;
    case INCOMPARABLE:
      NonVariableNonTypeIterator::NonVariableNonTypeIterator(&local_50,&lit->super_Term,false);
      iVar2 = (*local_50.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore[2])(&local_50);
      if ((char)iVar2 == '\0') {
        ::Lib::VirtualIterator<Kernel::Term_*>::getEmpty();
        goto LAB_0052ebfc;
      }
      puVar4 = (undefined8 *)::operator_new(0x20);
      *(undefined4 *)(puVar4 + 1) = 0;
      *puVar4 = &PTR__UniquePersistentIterator_00b63b48;
      pIVar5 = ::Lib::UniquePersistentIterator<Kernel::NonVariableNonTypeIterator>::
               getUniqueItemList(&local_50,puVar4 + 3);
      goto LAB_0052ebab;
    default:
      term = (Term *)0x2;
      goto LAB_0052ecf5;
    }
    term = (Term *)pTVar7->_content;
LAB_0052ecf5:
    if (((ulong)term & 3) == 0) {
      this_00 = (NonVariableNonTypeIterator *)::operator_new(0x38);
      NonVariableNonTypeIterator::NonVariableNonTypeIterator(this_00,term,true);
      piVar1 = &(this_00->super_IteratorCore<Kernel::Term_*>)._refCnt;
      *piVar1 = *piVar1 + 1;
      local_58._core = (IteratorCore<Kernel::Term_*> *)this_00;
      iVar2 = (*(this_00->super_IteratorCore<Kernel::Term_*>)._vptr_IteratorCore[2])(this_00);
      if ((char)iVar2 == '\0') {
        ::Lib::VirtualIterator<Kernel::Term_*>::getEmpty();
      }
      else {
        puVar4 = (undefined8 *)::operator_new(0x20);
        *(undefined4 *)(puVar4 + 1) = 0;
        *puVar4 = &PTR__UniquePersistentIterator_00b67238;
        pIVar8 = ::Lib::UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_>::
                 getUniqueItemList(&local_58,puVar4 + 3);
        puVar4[2] = pIVar8;
        *(undefined8 **)this = puVar4;
        *(int *)(puVar4 + 1) = *(int *)(puVar4 + 1) + 1;
      }
      if ((NonVariableNonTypeIterator *)local_58._core != (NonVariableNonTypeIterator *)0x0) {
        piVar1 = &(local_58._core)->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*((IteratorCore<Kernel::Term_*> *)&(local_58._core)->_vptr_IteratorCore)->
            _vptr_IteratorCore[1])();
        }
      }
    }
    else {
      ::Lib::VirtualIterator<Kernel::Term_*>::getEmpty();
    }
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  NonVariableNonTypeIterator::NonVariableNonTypeIterator(&local_50,&lit->super_Term,false);
  iVar2 = (*local_50.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore[2])(&local_50);
  if ((char)iVar2 == '\0') {
    ::Lib::VirtualIterator<Kernel::Term_*>::getEmpty();
    goto LAB_0052ebfc;
  }
  puVar4 = (undefined8 *)::operator_new(0x20);
  *(undefined4 *)(puVar4 + 1) = 0;
  *puVar4 = &PTR__UniquePersistentIterator_00b63b48;
  pIVar5 = ::Lib::UniquePersistentIterator<Kernel::NonVariableNonTypeIterator>::getUniqueItemList
                     (&local_50,puVar4 + 3);
LAB_0052ebab:
  puVar4[2] = pIVar5;
  *(undefined8 **)this = puVar4;
  *(int *)(puVar4 + 1) = *(int *)(puVar4 + 1) + 1;
LAB_0052ebfc:
  local_50.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore =
       (_func_int **)&PTR__NonVariableNonTypeIterator_00b69b28;
  if (local_50._stack._stack == (Term **)0x0) {
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  uVar6 = local_50._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
  if (uVar6 == 0) {
    *local_50._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._stack._stack;
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  if (uVar6 < 0x11) {
    *local_50._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_50._stack._stack;
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  if (uVar6 < 0x19) {
    *local_50._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_50._stack._stack;
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  if (uVar6 < 0x21) {
    *local_50._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._stack._stack;
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  if (uVar6 < 0x31) {
    *local_50._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._stack._stack;
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  if (uVar6 < 0x41) {
    *local_50._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._stack._stack;
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  operator_delete(local_50._stack._stack,0x10);
  return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
}

Assistant:

VirtualIterator<ELEMENT_TYPE(SubtermIterator)> EqHelper::getRewritableSubtermIterator(Literal* lit, const Ordering& ord)
{
  if (lit->isEquality()) {
    TermList sel;
    switch(ord.getEqualityArgumentOrder(lit)) {
    case Ordering::INCOMPARABLE: {
      SubtermIterator si(lit);
      return getUniquePersistentIteratorFromPtr(&si);
    }
    case Ordering::EQUAL:
    case Ordering::GREATER:
      sel=*lit->nthArgument(0);
      break;
    case Ordering::LESS:
      sel=*lit->nthArgument(1);
      break;
#if VDEBUG
    default:
      ASSERTION_VIOLATION;
#endif
    }
    if (!sel.isTerm()) {
      return VirtualIterator<ELEMENT_TYPE(SubtermIterator)>::getEmpty();
    }
    return getUniquePersistentIterator(vi(new SubtermIterator(sel.term(), true)));
  }

  SubtermIterator si(lit);
  return getUniquePersistentIteratorFromPtr(&si);

}